

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl_rtc.cc
# Opt level: O3

void __thiscall
aom::AV1RateControlRTC::PostEncodeUpdate(AV1RateControlRTC *this,uint64_t encoded_frame_size)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  AV1_COMP *pAVar4;
  
  pAVar4 = this->cpi_;
  puVar1 = &(pAVar4->common).current_frame.frame_number;
  *puVar1 = *puVar1 + 1;
  av1_rc_postencode_update(pAVar4,encoded_frame_size);
  pAVar4 = this->cpi_;
  iVar3 = (pAVar4->svc).number_spatial_layers;
  if ((pAVar4->svc).spatial_layer_id == iVar3 + -1) {
    (pAVar4->svc).prev_number_spatial_layers = iVar3;
    piVar2 = &(pAVar4->rc).frames_since_key;
    *piVar2 = *piVar2 + 1;
  }
  if ((iVar3 < 2) && ((pAVar4->svc).number_temporal_layers < 2)) {
    return;
  }
  av1_save_layer_context(pAVar4);
  return;
}

Assistant:

void AV1RateControlRTC::PostEncodeUpdate(uint64_t encoded_frame_size) {
  cpi_->common.current_frame.frame_number++;
  av1_rc_postencode_update(cpi_, encoded_frame_size);
  if (cpi_->svc.spatial_layer_id == cpi_->svc.number_spatial_layers - 1) {
    cpi_->svc.prev_number_spatial_layers = cpi_->svc.number_spatial_layers;
    cpi_->rc.frames_since_key++;
  }
  if (cpi_->svc.number_spatial_layers > 1 ||
      cpi_->svc.number_temporal_layers > 1)
    av1_save_layer_context(cpi_);
}